

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvtkmesh.cpp
# Opt level: O0

void __thiscall
TPZVTKGraphMesh::TPZVTKGraphMesh
          (TPZVTKGraphMesh *this,TPZCompMesh *cmesh,int dimension,
          set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *tensnames)

{
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI;
  undefined4 in_stack_00000040;
  void **in_stack_00000058;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000070;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000078;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc0;
  
  TPZGraphMesh::TPZGraphMesh
            ((TPZGraphMesh *)tensnames,in_stack_00000058,(TPZCompMesh *)this,cmesh._4_4_,
             (set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(dimension,in_stack_00000040)
             ,(TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)matids,in_stack_00000070,in_stack_00000078);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZVTKGraphMesh_02531c90;
  *(undefined4 *)&in_RDI[0x28].fStore = 0;
  *(undefined4 *)((long)&in_RDI[0x28].fStore + 4) = 0;
  *(undefined4 *)((long)&in_RDI[0x14]._vptr_TPZVec + 4) = 3;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(in_stack_ffffffffffffffc0,in_RDI);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(in_stack_ffffffffffffffc0,in_RDI);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(in_stack_ffffffffffffffc0,in_RDI);
  return;
}

Assistant:

TPZVTKGraphMesh::TPZVTKGraphMesh(TPZCompMesh *cmesh, int dimension, const std::set<int> & matids, const TPZVec<std::string> &scalnames, const TPZVec<std::string> &vecnames, const TPZVec<std::string> &tensnames): TPZGraphMesh(cmesh, dimension, matids,scalnames,vecnames,tensnames) {
    fNumCases = 0;
    fNumSteps = 0;
    fStyle = EVTKStyle;
    fVecNames = vecnames;
    fScalarNames = scalnames;
    fTensorNames = tensnames;
}